

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

node_t * __thiscall
expression_tree::
node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
::operator=(node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  leaf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
  *this_local;
  
  this_00 = (leaf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)operator_new(0x10);
  detail::leaf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  leaf(this_00,t);
  std::
  unique_ptr<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<expression_tree::detail::node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::reset(&this->impl,(pointer)this_00);
  if (this->parent != (node_t *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const T* t)
	{
		impl.reset(new detail::leaf<T*>(t));

		if(parent)
		{
			parent->modified();
		}

		return *this;
	}